

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetProcAddressExtensionCase::executeTest(GetProcAddressExtensionCase *this)

{
  deUint32 err;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  string *extName;
  FunctionNames FVar2;
  MessageBuilder local_4e0;
  __eglMustCastToProperFunctionPointerType local_360;
  _func_void *funcPtr;
  char *funcName;
  undefined1 local_348 [4];
  int funcNdx;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  int local_30;
  FunctionNames funcNames;
  bool supported;
  TestLog *log;
  GetProcAddressExtensionCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode
                       .m_testCtx);
  extName = &this->m_extName;
  funcNames.functions._7_1_ =
       GetProcAddressCase::isSupported(&this->super_GetProcAddressCase,extName);
  FVar2 = egl::anon_unknown_0::getExtFunctionNames(extName);
  funcNames._0_8_ = FVar2.functions;
  local_30 = FVar2.numFunctions;
  tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1b0,extName);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a0a8b4);
  local_1c8[0] = "not supported";
  if ((funcNames.functions._7_1_ & 1) != 0) {
    local_1c8[0] = "supported";
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_348,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_348);
  for (funcName._4_4_ = 0; funcName._4_4_ < local_30; funcName._4_4_ = funcName._4_4_ + 1) {
    funcPtr = *(_func_void **)(funcNames._0_8_ + (long)funcName._4_4_ * 8);
    local_360 = eglu::CallLogWrapper::eglGetProcAddress
                          (&(this->super_GetProcAddressCase).super_CallLogWrapper,(char *)funcPtr);
    err = eglu::CallLogWrapper::eglGetError(&(this->super_GetProcAddressCase).super_CallLogWrapper);
    eglu::checkError(err,"eglGetProcAddress()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                     ,0xcc);
    if (((funcNames.functions._7_1_ & 1) != 0) &&
       (local_360 == (__eglMustCastToProperFunctionPointerType)0x0)) {
      tcu::TestLog::operator<<(&local_4e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_4e0,
                          (char (*) [63])
                          "Fail, received null pointer for supported extension function: ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char **)&funcPtr);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      tcu::TestContext::setTestResult
                ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Unexpected null pointer");
    }
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		bool					supported	= isSupported(m_extName);
		const FunctionNames		funcNames	= getExtFunctionNames(m_extName);

		DE_ASSERT(funcNames.numFunctions > 0);

		log << TestLog::Message << m_extName << ": " << (supported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName		= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (supported && funcPtr == 0)
			{
				log << TestLog::Message << "Fail, received null pointer for supported extension function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
		}
	}